

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O0

int ecx_BWR(ecx_portt *port,uint16 ADP,uint16 ADO,uint16 length,void *data,int timeout)

{
  uint uVar1;
  int iVar2;
  int wkc;
  uint8 idx;
  int timeout_local;
  void *data_local;
  uint16 length_local;
  uint16 ADO_local;
  uint16 ADP_local;
  ecx_portt *port_local;
  
  uVar1 = ecx_getindex(port);
  ecx_setupdatagram(port,port->txbuf + (byte)uVar1,'\b',(byte)uVar1,ADP,ADO,length,data);
  iVar2 = ecx_srconfirm(port,uVar1 & 0xff,timeout);
  ecx_setbufstat(port,uVar1 & 0xff,0);
  return iVar2;
}

Assistant:

int ecx_BWR (ecx_portt *port, uint16 ADP, uint16 ADO, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   /* get fresh index */
   idx = ecx_getindex (port);
   /* setup datagram */
   ecx_setupdatagram (port, &(port->txbuf[idx]), EC_CMD_BWR, idx, ADP, ADO, length, data);
   /* send data and wait for answer */
   wkc = ecx_srconfirm (port, idx, timeout);
   /* clear buffer status */
   ecx_setbufstat (port, idx, EC_BUF_EMPTY);

   return wkc;
}